

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadAnimationClipLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__s;
  undefined4 extraout_var_02;
  size_type sVar4;
  undefined4 extraout_var_03;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  value_type local_140;
  allocator<char> local_119;
  string local_118;
  char *local_f8;
  char *url;
  undefined1 local_e8 [4];
  int indexUrl;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  clip;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint local_48;
  int indexID;
  uint local_34;
  string local_30 [4];
  int indexName;
  string animName;
  ColladaParser *this_local;
  
  animName.field_2._8_8_ = this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"animation_clip");
        if (bVar1) {
          std::__cxx11::string::string(local_30);
          local_34 = TestAttribute(this,"name");
          local_48 = TestAttribute(this,"id");
          if ((int)local_34 < 0) {
            if ((int)local_48 < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_88,"animation_",&local_89);
              sVar4 = std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::size(&this->mAnimationClipLibrary);
              to_string<unsigned_long>
                        ((string *)
                         &clip.second.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar4);
              std::operator+(&local_68,&local_88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &clip.second.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::operator=(local_30,(string *)&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              std::__cxx11::string::~string
                        ((string *)
                         &clip.second.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string((string *)&local_88);
              std::allocator<char>::~allocator(&local_89);
            }
            else {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_48);
              std::__cxx11::string::operator=(local_30,(char *)CONCAT44(extraout_var_00,iVar3));
            }
          }
          else {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_34);
            std::__cxx11::string::operator=(local_30,(char *)CONCAT44(extraout_var,iVar3));
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_e8);
          std::__cxx11::string::operator=((string *)local_e8,local_30);
          do {
            while( true ) {
              uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              if ((uVar2 & 1) == 0) goto LAB_00670dcc;
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 != 1) break;
              bVar1 = IsElement(this,"instance_animation");
              if (bVar1) {
                url._4_4_ = TestAttribute(this,"url");
                if (-1 < (int)url._4_4_) {
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)url._4_4_);
                  local_f8 = (char *)CONCAT44(extraout_var_01,iVar3);
                  if (*local_f8 != '#') {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_118,"Unknown reference format",&local_119);
                    ThrowException(this,&local_118);
                  }
                  __s = local_f8 + 1;
                  local_f8 = __s;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_140,__s,&local_141);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&clip.first.field_2 + 8),&local_140);
                  std::__cxx11::string::~string((string *)&local_140);
                  std::allocator<char>::~allocator(&local_141);
                }
              }
              else {
                SkipElement(this);
              }
            }
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          } while (iVar3 != 2);
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"animation_clip");
          if (iVar3 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"Expected end of <animation_clip> element.",&local_169);
            ThrowException(this,&local_168);
          }
LAB_00670dcc:
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&clip.first.field_2 + 8));
          if (sVar4 != 0) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::push_back(&this->mAnimationClipLibrary,(value_type *)local_e8);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_e8);
          std::__cxx11::string::~string(local_30);
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"library_animation_clips");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"Expected end of <library_animation_clips> element.",
                 &local_191);
      ThrowException(this,&local_190);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimationClipLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("animation_clip"))
            {
                // optional name given as an attribute
                std::string animName;
                int indexName = TestAttribute("name");
                int indexID = TestAttribute("id");
                if (indexName >= 0)
                    animName = mReader->getAttributeValue(indexName);
                else if (indexID >= 0)
                    animName = mReader->getAttributeValue(indexID);
                else
                    animName = std::string("animation_") + to_string(mAnimationClipLibrary.size());

                std::pair<std::string, std::vector<std::string> > clip;

                clip.first = animName;

                while (mReader->read())
                {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
                    {
                        if (IsElement("instance_animation"))
                        {
                            int indexUrl = TestAttribute("url");
                            if (indexUrl >= 0)
                            {
                                const char* url = mReader->getAttributeValue(indexUrl);
                                if (url[0] != '#')
                                    ThrowException("Unknown reference format");

                                url++;

                                clip.second.push_back(url);
                            }
                        }
                        else
                        {
                            // ignore the rest
                            SkipElement();
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
                    {
                        if (strcmp(mReader->getNodeName(), "animation_clip") != 0)
                            ThrowException("Expected end of <animation_clip> element.");

                        break;
                    }
                }

                if (clip.second.size() > 0)
                {
                    mAnimationClipLibrary.push_back(clip);
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_animation_clips") != 0)
                ThrowException("Expected end of <library_animation_clips> element.");

            break;
        }
    }
}